

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O2

complex<float> cdotc(int n,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  complex<float> in_RAX;
  complex<float> cVar1;
  int iVar2;
  long lVar4;
  complex<float> *__y;
  undefined4 *puVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  complex<float> local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar3;
  
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
    cVar1._M_value = (_ComplexT_conflict)(incx ^ 1U);
    if (incy == 1 && (incx ^ 1U) == 0) {
      local_48 = 0.0;
      fStack_44 = 0.0;
      fStack_40 = 0.0;
      fStack_3c = 0.0;
      for (lVar4 = 0; uVar3 << 3 != lVar4; lVar4 = lVar4 + 8) {
        local_50._M_value =
             CONCAT44(*(undefined4 *)((long)&cx->_M_value + lVar4 + 4),
                      *(undefined4 *)((long)&cx->_M_value + lVar4)) ^ 0x8000000000000000;
        cVar1 = std::operator*(&local_50,(complex<float> *)((long)&cy->_M_value + lVar4));
        local_48 = local_48 + extraout_XMM0_Da;
        fStack_44 = fStack_44 + extraout_XMM0_Db;
        fStack_40 = fStack_40 + extraout_XMM0_Dc;
        fStack_3c = fStack_3c + extraout_XMM0_Dd;
      }
    }
    else {
      cVar1._M_value = (_ComplexT_conflict)(incy >> 0x1f & (1 - n) * incy);
      puVar5 = (undefined4 *)((long)&cx[incx >> 0x1f & (1 - n) * incx]._M_value + 4);
      __y = cy + cVar1._M_value;
      local_48 = 0.0;
      fStack_44 = 0.0;
      fStack_40 = 0.0;
      fStack_3c = 0.0;
      while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
        local_50._M_value = CONCAT44(*puVar5,puVar5[-1]) ^ 0x8000000000000000;
        cVar1 = std::operator*(&local_50,__y);
        local_48 = local_48 + extraout_XMM0_Da_00;
        fStack_44 = fStack_44 + extraout_XMM0_Db_00;
        fStack_40 = fStack_40 + extraout_XMM0_Dc_00;
        fStack_3c = fStack_3c + extraout_XMM0_Dd_00;
        puVar5 = puVar5 + (long)incx * 2;
        __y = __y + incy;
      }
    }
    return (complex<float>)cVar1._M_value;
  }
  return (complex<float>)in_RAX._M_value;
}

Assistant:

complex <float> cdotc ( int n, complex <float> cx[], int incx,
  complex <float> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CDOTC forms the conjugated dot product of two vectors.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, complex <float> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries in CX.
//
//    Input, complex <float> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries in CY.
//
//    Output, complex <float> CDOTC, the conjugated dot product of
//    the corresponding entries of CX and CY.
//
{
  int i;
  int ix;
  int iy;
  complex <float> value;

  value = complex <float> ( 0.0, 0.0 );

  if ( n <= 0 )
  {
    return value;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[i] ) * cy[i];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[ix] ) * cy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return value;
}